

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::GetLocalObjectFiles
          (cmLocalUnixMakefileGenerator3 *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
          *localObjectFiles)

{
  cmMakefile *this_00;
  cmSourceFile *source;
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  mapped_type *this_01;
  undefined8 uVar4;
  _Base_ptr p_Var5;
  bool hasSourceExtension;
  string dir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  string objectName;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  bool local_111;
  undefined1 local_110 [8];
  _Alloc_hider local_108;
  undefined1 local_100 [24];
  string local_e8;
  undefined8 local_c8;
  cmLocalUnixMakefileGenerator3 *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Base_ptr local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Base_ptr local_78;
  _Base_ptr local_70;
  string local_68;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> local_48;
  
  local_c0 = this;
  local_70 = (_Base_ptr)localObjectFiles;
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            (&local_48,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets
            );
  if (local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    p_Var5 = (_Base_ptr)
             local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      local_c8 = *(undefined8 *)p_Var5;
      TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)local_c8);
      if (TVar2 != INTERFACE_LIBRARY) {
        local_b8._M_allocated_capacity = 0;
        local_b8._8_8_ = (undefined8 *)0x0;
        local_a8 = (_Base_ptr)0x0;
        this_00 = (local_c0->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"CMAKE_BUILD_TYPE","");
        pcVar3 = cmMakefile::GetSafeDefinition(this_00,&local_e8);
        std::__cxx11::string::string((string *)local_110,pcVar3,(allocator *)&local_68);
        cmGeneratorTarget::GetObjectSources
                  ((cmGeneratorTarget *)local_c8,
                   (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_b8,
                   (string *)local_110);
        if (local_110 != (undefined1  [8])local_100) {
          operator_delete((void *)local_110,
                          (ulong)&(((cmPropertyMap *)local_100._0_8_)->
                                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                                  )._M_t._M_impl.field_0x1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        local_e8._M_string_length = 0;
        local_e8.field_2._M_local_buf[0] = '\0';
        local_78 = p_Var5;
        cmLocalGenerator::GetCurrentBinaryDirectory(*(cmLocalGenerator **)(local_c8 + 0x10));
        std::__cxx11::string::append((char *)&local_e8);
        std::__cxx11::string::append((char *)&local_e8);
        (*(local_c0->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator
          [0xb])((LocalObjectEntry *)local_110,local_c0,local_c8);
        std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_110);
        if (local_110 != (undefined1  [8])local_100) {
          operator_delete((void *)local_110,
                          (ulong)&(((cmPropertyMap *)local_100._0_8_)->
                                  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                                  )._M_t._M_impl.field_0x1);
        }
        std::__cxx11::string::append((char *)&local_e8);
        for (uVar4 = local_b8._M_allocated_capacity; uVar4 != local_b8._8_8_; uVar4 = uVar4 + 8) {
          source = *(cmSourceFile **)uVar4;
          local_111 = true;
          cmLocalGenerator::GetObjectFileNameWithoutTarget
                    (&local_68,(cmLocalGenerator *)local_c0,source,&local_e8,&local_111);
          bVar1 = cmsys::SystemTools::FileIsFullPath(local_68._M_dataplus._M_p);
          if (bVar1) {
            cmsys::SystemTools::GetFilenameName((string *)local_110,&local_68);
            std::__cxx11::string::operator=((string *)&local_68,(string *)local_110);
            if (local_110 != (undefined1  [8])local_100) {
              operator_delete((void *)local_110,
                              (ulong)&(((cmPropertyMap *)local_100._0_8_)->
                                      super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                                      )._M_t._M_impl.field_0x1);
            }
          }
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                                  *)local_70,&local_68);
          this_01->HasSourceExtension = local_111;
          cmSourceFile::GetLanguage_abi_cxx11_((string *)&local_98,source);
          local_110 = (undefined1  [8])local_c8;
          local_108._M_p = local_100 + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,local_98._M_allocated_capacity,
                     local_98._8_8_ + local_98._M_allocated_capacity);
          std::
          vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
          ::emplace_back<cmLocalUnixMakefileGenerator3::LocalObjectEntry>
                    (&this_01->
                      super_vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                     ,(LocalObjectEntry *)local_110);
          if (local_108._M_p != local_100 + 8) {
            operator_delete(local_108._M_p,local_100._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_allocated_capacity != &local_88) {
            operator_delete((void *)local_98._M_allocated_capacity,
                            local_88._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,
                          CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                   local_e8.field_2._M_local_buf[0]) + 1);
        }
        p_Var5 = local_78;
        if ((undefined8 *)local_b8._M_allocated_capacity != (undefined8 *)0x0) {
          operator_delete((void *)local_b8._M_allocated_capacity,(long)local_a8 - local_b8._0_8_);
        }
      }
      p_Var5 = (_Base_ptr)&p_Var5->_M_parent;
    } while (p_Var5 != (_Base_ptr)
                       local_48.
                       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((_Base_ptr)
      local_48.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
      .super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_48.
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::
GetLocalObjectFiles(std::map<std::string, LocalObjectInfo> &localObjectFiles)
{
  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  for(std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
      ti != targets.end(); ++ti)
    {
    cmGeneratorTarget* gt = *ti;
    if (gt->GetType() == cmState::INTERFACE_LIBRARY)
      {
      continue;
      }
    std::vector<cmSourceFile const*> objectSources;
    gt->GetObjectSources(objectSources, this->Makefile
                                    ->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    // Compute full path to object file directory for this target.
    std::string dir;
    dir += gt->LocalGenerator->GetCurrentBinaryDirectory();
    dir += "/";
    dir += this->GetTargetDirectory(gt);
    dir += "/";
    // Compute the name of each object file.
    for(std::vector<cmSourceFile const*>::iterator
          si = objectSources.begin();
        si != objectSources.end(); ++si)
      {
      cmSourceFile const* sf = *si;
      bool hasSourceExtension = true;
      std::string objectName = this->GetObjectFileNameWithoutTarget(*sf,
                                                                    dir,
                                                        &hasSourceExtension);
      if(cmSystemTools::FileIsFullPath(objectName.c_str()))
        {
        objectName = cmSystemTools::GetFilenameName(objectName);
        }
      LocalObjectInfo& info = localObjectFiles[objectName];
      info.HasSourceExtension = hasSourceExtension;
      info.push_back(LocalObjectEntry(gt, sf->GetLanguage()));
      }
    }
}